

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

bool __thiscall
adios2::core::engine::BP5Reader::ReadActiveFlag
          (BP5Reader *this,vector<char,_std::allocator<char>_> *buffer)

{
  char cVar1;
  pointer pcVar2;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar2) < 0x27) {
    std::__cxx11::string::string((string *)&local_30,"Engine",&local_91);
    std::__cxx11::string::string((string *)&local_50,"BP5Reader",&local_92);
    std::__cxx11::string::string((string *)&local_70,"ReadActiveFlag",&local_93);
    std::__cxx11::string::string
              ((string *)&local_90,"called with a buffer smaller than required",&local_94);
    helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  cVar1 = pcVar2[0x27];
  this->m_WriterIsActive = cVar1 == '\x01';
  return cVar1 == '\x01';
}

Assistant:

bool BP5Reader::ReadActiveFlag(std::vector<char> &buffer)
{
    if (buffer.size() < m_ActiveFlagPosition)
    {
        helper::Throw<std::runtime_error>("Engine", "BP5Reader", "ReadActiveFlag",
                                          "called with a buffer smaller than required");
    }
    // Writer active flag
    size_t position = m_ActiveFlagPosition;
    const char activeChar =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_WriterIsActive = (activeChar == '\1' ? true : false);
    return m_WriterIsActive;
}